

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O3

int32_t __thiscall
icu_63::NFRule::findText
          (NFRule *this,UnicodeString *str,UnicodeString *key,int32_t startingAt,int32_t *length)

{
  UnicodeString *this_00;
  short sVar1;
  ushort uVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int32_t len;
  int32_t iVar6;
  int32_t iVar7;
  undefined4 uVar8;
  int32_t iVar9;
  uint start;
  int start_00;
  uint uVar10;
  int iVar11;
  char16_t *srcChars;
  UnicodeString suffix;
  UnicodeString prefix;
  Formattable result;
  FieldPosition local_138;
  UnicodeString local_120;
  UnicodeString local_e0;
  Formattable local_a0;
  
  if (this->rulePatternFormat == (PluralFormat *)0x0) {
    iVar5 = (*(this->formatter->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x19])
                      ();
    if ((char)iVar5 != '\0') {
      iVar9 = findTextLenient(this,str,key,startingAt,length);
      return iVar9;
    }
    sVar1 = (key->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar5 = (key->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    *length = iVar5;
    sVar1 = (str->fUnion).fStackFields.fLengthAndFlags;
    if (startingAt < 0) {
      iVar5 = (str->fUnion).fFields.fLength;
      iVar11 = (int)sVar1 >> 5;
      start_00 = 0;
    }
    else {
      iVar11 = (int)sVar1 >> 5;
      iVar5 = (str->fUnion).fFields.fLength;
      start_00 = iVar11;
      if (sVar1 < 0) {
        start_00 = iVar5;
      }
      if (startingAt <= start_00) {
        start_00 = startingAt;
      }
    }
    uVar2 = (key->fUnion).fStackFields.fLengthAndFlags;
    if ((short)uVar2 < 0) {
      iVar9 = (key->fUnion).fFields.fLength;
    }
    else {
      iVar9 = (int)(short)uVar2 >> 5;
    }
    if (sVar1 < 0) {
      iVar11 = iVar5;
    }
    if (((int)(short)uVar2 & 1U) != 0) {
      return -1;
    }
    if (iVar9 < 0) {
      return -1;
    }
    if (iVar9 == 0) {
      return -1;
    }
    if ((uVar2 & 2) == 0) {
      srcChars = (key->fUnion).fFields.fArray;
    }
    else {
      srcChars = (key->fUnion).fStackFields.fBuffer;
    }
    iVar9 = UnicodeString::indexOf(str,srcChars,0,iVar9,start_00,iVar11 - start_00);
    return iVar9;
  }
  Formattable::Formattable(&local_a0);
  local_138.super_UObject._vptr_UObject = (_func_int **)&PTR__FieldPosition_003b0e08;
  local_138.fField = 0;
  local_138.fEndIndex = 0;
  local_138.fBeginIndex = startingAt;
  PluralFormat::parseType(this->rulePatternFormat,str,this,&local_a0,&local_138);
  iVar9 = local_138.fBeginIndex;
  if (-1 < local_138.fBeginIndex) {
    this_00 = &this->fRuleText;
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar10 = (this->fRuleText).fUnion.fFields.fLength;
    }
    else {
      uVar10 = (int)sVar1 >> 5;
    }
    start = (int)uVar10 >> 0x1f & uVar10;
    len = UnicodeString::indexOf(this_00,L"$(",0,-1,start,uVar10 - start);
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (len < 0) {
      iVar7 = (this->fRuleText).fUnion.fFields.fLength;
      iVar5 = 0;
    }
    else {
      iVar7 = (this->fRuleText).fUnion.fFields.fLength;
      iVar5 = (int)sVar1 >> 5;
      if (sVar1 < 0) {
        iVar5 = iVar7;
      }
      if (len <= iVar5) {
        iVar5 = len;
      }
    }
    iVar11 = (int)sVar1 >> 5;
    if (sVar1 < 0) {
      iVar11 = iVar7;
    }
    iVar6 = UnicodeString::indexOf(this_00,L")$",0,-1,iVar5,iVar11 - iVar5);
    iVar7 = local_138.fEndIndex;
    UnicodeString::tempSubString(&local_e0,this_00,0,len);
    UnicodeString::tempSubString(&local_120,this_00,iVar6 + 2,0x7fffffff);
    if ((local_e0.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
      uVar8 = local_e0.fUnion.fFields.fLength;
      if (-1 < local_e0.fUnion.fStackFields.fLengthAndFlags) {
        uVar8 = (int)local_e0.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      iVar5 = 0;
      if ((int)uVar8 < 0) {
        iVar5 = uVar8;
      }
      iVar11 = uVar8 - iVar5;
      if ((int)uVar8 <= uVar8 - iVar5) {
        iVar11 = uVar8;
      }
      if ((int)uVar8 < 0) {
        iVar11 = 0;
      }
      if ((local_e0.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
        local_e0.fUnion.fFields.fArray = local_e0.fUnion.fStackFields.fBuffer;
      }
      bVar4 = UnicodeString::doCompare
                        (str,iVar9 - uVar8,uVar8,local_e0.fUnion.fFields.fArray,iVar5,iVar11);
    }
    else {
      bVar4 = ~*(byte *)&str->fUnion & 1;
    }
    bVar3 = true;
    if (bVar4 == 0) {
      if ((local_120.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
        uVar8 = local_120.fUnion.fFields.fLength;
        if (-1 < local_120.fUnion.fStackFields.fLengthAndFlags) {
          uVar8 = (int)local_120.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        iVar5 = 0;
        if ((int)uVar8 < 0) {
          iVar5 = uVar8;
        }
        iVar11 = uVar8 - iVar5;
        if ((int)uVar8 <= uVar8 - iVar5) {
          iVar11 = uVar8;
        }
        if ((int)uVar8 < 0) {
          iVar11 = 0;
        }
        if ((local_120.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
          local_120.fUnion.fFields.fArray = local_120.fUnion.fStackFields.fBuffer;
        }
        bVar4 = UnicodeString::doCompare
                          (str,iVar7,uVar8,local_120.fUnion.fFields.fArray,iVar5,iVar11);
      }
      else {
        bVar4 = ~*(byte *)&str->fUnion & 1;
      }
      if (bVar4 == 0) {
        if (-1 < local_e0.fUnion.fStackFields.fLengthAndFlags) {
          local_e0.fUnion.fFields.fLength = (int)local_e0.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        if (-1 < local_120.fUnion.fStackFields.fLengthAndFlags) {
          local_120.fUnion.fFields.fLength = (int)local_120.fUnion.fStackFields.fLengthAndFlags >> 5
          ;
        }
        *length = (iVar7 - iVar9) + local_e0.fUnion.fFields.fLength +
                  local_120.fUnion.fFields.fLength;
        iVar9 = iVar9 - local_e0.fUnion.fFields.fLength;
        bVar3 = false;
      }
    }
    UnicodeString::~UnicodeString(&local_120);
    UnicodeString::~UnicodeString(&local_e0);
    if (!bVar3) goto LAB_0025861f;
  }
  *length = 0;
  iVar9 = -1;
LAB_0025861f:
  FieldPosition::~FieldPosition(&local_138);
  Formattable::~Formattable(&local_a0);
  return iVar9;
}

Assistant:

int32_t
NFRule::findText(const UnicodeString& str,
                 const UnicodeString& key,
                 int32_t startingAt,
                 int32_t* length) const
{
    if (rulePatternFormat) {
        Formattable result;
        FieldPosition position(UNUM_INTEGER_FIELD);
        position.setBeginIndex(startingAt);
        rulePatternFormat->parseType(str, this, result, position);
        int start = position.getBeginIndex();
        if (start >= 0) {
            int32_t pluralRuleStart = fRuleText.indexOf(gDollarOpenParenthesis, -1, 0);
            int32_t pluralRuleSuffix = fRuleText.indexOf(gClosedParenthesisDollar, -1, pluralRuleStart) + 2;
            int32_t matchLen = position.getEndIndex() - start;
            UnicodeString prefix(fRuleText.tempSubString(0, pluralRuleStart));
            UnicodeString suffix(fRuleText.tempSubString(pluralRuleSuffix));
            if (str.compare(start - prefix.length(), prefix.length(), prefix, 0, prefix.length()) == 0
                    && str.compare(start + matchLen, suffix.length(), suffix, 0, suffix.length()) == 0)
            {
                *length = matchLen + prefix.length() + suffix.length();
                return start - prefix.length();
            }
        }
        *length = 0;
        return -1;
    }
    if (!formatter->isLenient()) {
        // if lenient parsing is turned off, this is easy: just call
        // String.indexOf() and we're done
        *length = key.length();
        return str.indexOf(key, startingAt);
    }
    else {
        // but if lenient parsing is turned ON, we've got some work
        // ahead of us
        return findTextLenient(str, key, startingAt, length);
    }
}